

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

char * __thiscall Quartet::index(Quartet *this,char *__s,int __c)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int __c_00;
  undefined4 in_stack_fffffffffffffff4;
  
  pcVar3 = Doublet::index(&this->bra,__s,__c);
  iVar2 = (int)pcVar3;
  iVar1 = Doublet::ncart((Doublet *)CONCAT44(in_stack_fffffffffffffff4,iVar2));
  iVar2 = iVar2 * iVar1;
  pcVar3 = Doublet::index(&this->ket,__s,__c_00);
  return (char *)(ulong)(uint)(iVar2 + (int)pcVar3);
}

Assistant:

int index(void) const { return bra.index() * ket.ncart() + ket.index(); }